

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

int currentpc(CallInfo *ci)

{
  CallInfo *ci_local;
  
  if ((ci->callstatus & 2) == 0) {
    __assert_fail("((ci)->callstatus & (1<<1))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                  ,0x2e,"int currentpc(CallInfo *)");
  }
  if (ci->func->tt_ != 0x8006) {
    __assert_fail("(((((ci)->func))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                  ,0x30,"int currentpc(CallInfo *)");
  }
  if (((ci->func->value_).gc)->tt != '\x06') {
    __assert_fail("((((ci)->func)->value_).gc)->tt == ((6) | ((0) << 4))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                  ,0x30,"int currentpc(CallInfo *)");
  }
  if (*(long *)(*(long *)((ci->func->value_).f + 0x18) + 0x38) == 0) {
    ci_local._4_4_ = 0;
  }
  else {
    if (ci->func->tt_ != 0x8006) {
      __assert_fail("(((((ci)->func))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                    ,0x32,"int currentpc(CallInfo *)");
    }
    if (((ci->func->value_).gc)->tt != '\x06') {
      __assert_fail("((((ci)->func)->value_).gc)->tt == ((6) | ((0) << 4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                    ,0x32,"int currentpc(CallInfo *)");
    }
    ci_local._4_4_ =
         (int)((long)(ci->u).l.savedpc - *(long *)(*(long *)((ci->func->value_).f + 0x18) + 0x38) >>
              2) + -1;
  }
  return ci_local._4_4_;
}

Assistant:

static int currentpc (CallInfo *ci) {
  lua_assert(isLua(ci));
  /* If this function was compiled using the source to JIT then no code available */
  if (ci_func(ci)->p->code == NULL)
    return 0;
  return pcRel(ci->u.l.savedpc, ci_func(ci)->p);
}